

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_progress(nk_context *ctx,nk_size *cur,nk_size max,int is_modifyable)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  ulong uVar3;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var4;
  nk_widget_layout_states nVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  nk_context *i;
  long lVar12;
  int *piVar13;
  nk_command_buffer *b;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect r;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect r_00;
  nk_rect rect_04;
  nk_rect rect_05;
  float local_b8;
  float fStack_b4;
  nk_rect bounds;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5292,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  if (cur == (nk_size *)0x0) {
    __assert_fail("cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5293,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5294,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  pnVar2 = pnVar1->layout;
  if (pnVar2 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5295,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  nVar5 = nk_widget(&bounds,ctx);
  if (nVar5 == NK_WIDGET_INVALID) {
    return 0;
  }
  i = (nk_context *)0x0;
  if ((nVar5 != NK_WIDGET_ROM) && ((pnVar2->flags & 0x1000) == 0)) {
    i = ctx;
  }
  uVar3 = *cur;
  fVar18 = (ctx->style).progress.border;
  fVar15 = fVar18 + (ctx->style).progress.padding.x;
  fVar18 = (ctx->style).progress.padding.y + fVar18;
  auVar19._4_4_ = fVar18 + fVar18;
  auVar19._0_4_ = fVar15 + fVar15;
  auVar19._8_8_ = 0;
  auVar20._8_8_ = 0;
  auVar20._0_4_ = bounds.w;
  auVar20._4_4_ = bounds.h;
  auVar20 = maxps(auVar19,auVar20);
  fVar22 = (float)max;
  local_b8 = bounds.x;
  fStack_b4 = bounds.y;
  local_b8 = fVar15 + local_b8;
  fStack_b4 = fVar18 + fStack_b4;
  fVar15 = auVar20._0_4_ - (fVar15 + fVar15);
  fVar18 = auVar20._4_4_ - (fVar18 + fVar18);
  if (uVar3 < max) {
    max = uVar3;
  }
  uVar11 = ctx->last_widget_state & 2 | 4;
  ctx->last_widget_state = uVar11;
  if ((is_modifyable != 0) && (i != (nk_context *)0x0)) {
    iVar8 = (i->input).mouse.buttons[0].down;
    iVar6 = nk_input_has_mouse_click_down_in_rect
                      (&i->input,NK_BUTTON_LEFT,
                       (nk_rect)CONCAT88(CONCAT44(fVar18,fVar15),CONCAT44(fStack_b4,local_b8)),1);
    rect.w = bounds.w;
    rect.h = bounds.h;
    rect.x = bounds.x;
    rect.y = bounds.y;
    iVar7 = nk_input_is_mouse_hovering_rect(&i->input,rect);
    if (iVar7 != 0) {
      ctx->last_widget_state = 0x12;
      uVar11 = 0x12;
    }
    if ((iVar8 != 0) && (iVar6 != 0)) {
      fVar16 = (i->input).mouse.pos.x - local_b8;
      if (fVar16 <= 0.0) {
        fVar16 = 0.0;
      }
      fVar17 = (fVar16 / fVar15) * fVar22;
      fVar16 = 0.0;
      if (0.0 <= fVar17) {
        fVar16 = fVar17;
      }
      fVar16 = (float)(~-(uint)(fVar17 < fVar22) & (uint)fVar22 |
                      (uint)fVar16 & -(uint)(fVar17 < fVar22));
      uVar10 = (ulong)fVar16;
      max = (long)(fVar16 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
      (i->input).mouse.buttons[0].clicked_pos.x = fVar15 * 0.5 + local_b8;
      uVar11 = uVar11 | 0x22;
      ctx->last_widget_state = uVar11;
    }
    if (((uVar11 & 0x10) == 0) ||
       (rect_00.w = bounds.w, rect_00.h = bounds.h, rect_00.x = bounds.x, rect_00.y = bounds.y,
       iVar8 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_00), iVar8 != 0)) {
      rect_01.w = bounds.w;
      rect_01.h = bounds.h;
      rect_01.x = bounds.x;
      rect_01.y = bounds.y;
      iVar8 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_01);
      uVar9 = 0x40;
      if (iVar8 == 0) goto LAB_00134f3b;
    }
    else {
      uVar9 = 8;
    }
    uVar11 = uVar11 | uVar9;
    ctx->last_widget_state = uVar11;
  }
LAB_00134f3b:
  b = &pnVar1->buffer;
  p_Var4 = (ctx->style).progress.draw_begin;
  if (p_Var4 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var4)(b,(nk_handle)(ctx->style).progress.userdata.ptr);
    uVar11 = ctx->last_widget_state;
  }
  uVar9 = uVar11 * 2 & 0x20;
  bVar14 = (uVar11 & 0x20) == 0;
  lVar12 = 0xa8;
  if (bVar14) {
    lVar12 = (ulong)uVar9 + 0x68;
  }
  uVar10 = 0x40;
  if (bVar14) {
    uVar10 = (ulong)uVar9;
  }
  piVar13 = (int *)((long)&(ctx->style).progress.normal.type + lVar12);
  if (*(int *)((long)&(ctx->style).progress.normal.type + uVar10) == 0) {
    rect_02.w = bounds.w;
    rect_02.h = bounds.h;
    rect_02.x = bounds.x;
    rect_02.y = bounds.y;
    nk_fill_rect(b,rect_02,(ctx->style).progress.rounding,
                 *(nk_color *)((long)&(ctx->style).progress.normal.data + uVar10));
    rect_03.w = bounds.w;
    rect_03.h = bounds.h;
    rect_03.x = bounds.x;
    rect_03.y = bounds.y;
    nk_stroke_rect(b,rect_03,(ctx->style).progress.rounding,(ctx->style).progress.border,
                   (ctx->style).progress.border_color);
  }
  else {
    r.w = bounds.w;
    r.h = bounds.h;
    r.x = bounds.x;
    r.y = bounds.y;
    nk_draw_image(b,r,(nk_image *)((long)&(ctx->style).progress.normal.data + uVar10),
                  (nk_color)0xffffffff);
  }
  auVar21._4_12_ =
       SUB1612(CONCAT412(auVar20._12_4_ - 0.0,CONCAT48(auVar20._8_4_ - 0.0,CONCAT44(fVar18,fVar15)))
               ,4);
  auVar21._0_4_ = fVar15 * ((float)uVar3 / fVar22);
  r_00._8_8_ = auVar21._0_8_;
  if (*piVar13 == 0) {
    rect_04.w = (float)(int)r_00._8_8_;
    rect_04.h = (float)(int)((ulong)r_00._8_8_ >> 0x20);
    rect_04.x = local_b8;
    rect_04.y = fStack_b4;
    nk_fill_rect(b,rect_04,(ctx->style).progress.rounding,*(nk_color *)(piVar13 + 2));
    rect_05.w = (float)(int)r_00._8_8_;
    rect_05.h = (float)(int)((ulong)r_00._8_8_ >> 0x20);
    rect_05.x = local_b8;
    rect_05.y = fStack_b4;
    nk_stroke_rect(b,rect_05,(ctx->style).progress.rounding,(ctx->style).progress.border,
                   (ctx->style).progress.border_color);
  }
  else {
    r_00.x = local_b8;
    r_00.y = fStack_b4;
    nk_draw_image(b,r_00,(nk_image *)(piVar13 + 2),(nk_color)0xffffffff);
  }
  p_Var4 = (ctx->style).progress.draw_end;
  if (p_Var4 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var4)(b,(nk_handle)(ctx->style).progress.userdata.ptr);
  }
  *cur = max;
  return (uint)(max != uVar3);
}

Assistant:

NK_API int
nk_progress(struct nk_context *ctx, nk_size *cur, nk_size max, int is_modifyable)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_input *in;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;
    nk_size old_value;

    NK_ASSERT(ctx);
    NK_ASSERT(cur);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !cur)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;

    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    old_value = *cur;
    *cur = nk_do_progress(&ctx->last_widget_state, &win->buffer, bounds,
            *cur, max, is_modifyable, &style->progress, in);
    return (*cur != old_value);
}